

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Get
          (PersistentStorageJson *this,RegistrarId *aId,Network *aRetValue)

{
  Status SVar1;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = GetId<ot::commissioner::persistent_storage::Network,ot::commissioner::persistent_storage::NetworkId>
                    (this,aId,aRetValue,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Get(NetworkId const &aId, Network &aRetValue)
{
    return GetId<Network, NetworkId>(aId, aRetValue, JSON_NWK);
}